

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void gen_goto_tb(DisasContext_conflict14 *ctx,int n,target_ulong_conflict dest)

{
  TCGContext_conflict9 *tcg_ctx_00;
  _Bool _Var1;
  TCGContext_conflict9 *tcg_ctx;
  target_ulong_conflict dest_local;
  int n_local;
  DisasContext_conflict14 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  _Var1 = use_goto_tb(ctx,dest);
  if (_Var1) {
    tcg_gen_goto_tb_tricore(tcg_ctx_00,n);
    gen_save_pc(ctx,dest);
    tcg_gen_exit_tb_tricore(tcg_ctx_00,(TranslationBlock *)(ctx->base).tb,n);
  }
  else {
    gen_save_pc(ctx,dest);
    tcg_gen_lookup_and_goto_ptr_tricore(tcg_ctx_00);
  }
  return;
}

Assistant:

static inline void gen_goto_tb(DisasContext *s, int n, uint64_t dest)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TranslationBlock *tb;

    tb = s->base.tb;
    if (use_goto_tb(s, n, dest)) {
        tcg_gen_goto_tb(tcg_ctx, n);
        gen_a64_set_pc_im(tcg_ctx, dest);
        tcg_gen_exit_tb(tcg_ctx, tb, n);
        s->base.is_jmp = DISAS_NORETURN;
    } else {
        gen_a64_set_pc_im(tcg_ctx, dest);
        if (s->ss_active) {
            gen_step_complete_exception(s);
        } else if (s->base.singlestep_enabled) {
            gen_exception_internal(tcg_ctx, EXCP_DEBUG);
        } else {
            tcg_gen_lookup_and_goto_ptr(tcg_ctx);
            s->base.is_jmp = DISAS_NORETURN;
        }
    }
}